

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CoverWriteStore(FILE *pFile,Min_Man_t *p)

{
  bool bVar1;
  int iVar2;
  Min_Cube_t *pCube;
  ulong uVar3;
  
  iVar2 = p->nVars;
  if (-1 < iVar2) {
    uVar3 = 0;
    do {
      pCube = p->ppStore[uVar3];
      if (pCube != (Min_Cube_t *)0x0) {
        do {
          printf("%2d : ",uVar3 & 0xffffffff);
          if (pCube == p->pBubble) {
            puts("Bubble");
          }
          else {
            Min_CubeWrite(pFile,pCube);
          }
          pCube = pCube->pNext;
        } while (pCube != (Min_Cube_t *)0x0);
        iVar2 = p->nVars;
      }
      bVar1 = (long)uVar3 < (long)iVar2;
      uVar3 = uVar3 + 1;
    } while (bVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Min_CoverWriteStore( FILE * pFile, Min_Man_t * p )
{
    Min_Cube_t * pCube;
    int i;
    for ( i = 0; i <= p->nVars; i++ )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        {
            printf( "%2d : ", i );
            if ( pCube == p->pBubble )
            {
                printf( "Bubble\n" );
                continue;
            }
            Min_CubeWrite( pFile, pCube );
        }
    }
    printf( "\n" );
}